

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

shared_ptr<libtorrent::torrent_info> __thiscall
libtorrent::aux::torrent::get_torrent_copy_with_hashes(torrent *this)

{
  digest32<256L> *this_00;
  pointer pdVar1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  long in_RSI;
  merkle_tree *this_01;
  shared_ptr<libtorrent::torrent_info> sVar3;
  vector<aux::vector<char>,_file_index_t> v2_hashes;
  vector<char,_std::allocator<char>_> out_layer;
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_b8;
  vector<sha256_hash> local_a0;
  void *local_88;
  undefined8 uStack_80;
  long local_78;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  merkle_tree *local_50;
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_48;
  
  if (((*(torrent_info **)(in_RSI + 0x18))->m_files).m_piece_length < 1) {
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    a_Stack_60[0]._M_pi._0_4_ = 0;
    a_Stack_60[0]._M_pi._4_4_ = 0;
  }
  else {
    local_68 = (torrent_info *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libtorrent::torrent_info,std::allocator<libtorrent::torrent_info>,libtorrent::torrent_info&>
              (a_Stack_60,(torrent_info **)&local_68,
               (allocator<libtorrent::torrent_info> *)&local_b8,*(torrent_info **)(in_RSI + 0x18));
    bVar2 = torrent_info::v2(local_68);
    in_RDX._M_pi = extraout_RDX;
    if (bVar2) {
      local_48.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      local_48.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
      local_48.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_48.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      local_b8.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01 = *(merkle_tree **)(in_RSI + 0x3f8);
      local_50 = *(merkle_tree **)(in_RSI + 0x400);
      if (this_01 == local_50) {
        local_48.
        super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        do {
          merkle_tree::get_piece_layer(&local_a0,this_01);
          local_88 = (void *)0x0;
          uStack_80 = 0;
          local_78 = 0;
          ::std::vector<char,_std::allocator<char>_>::reserve
                    ((vector<char,_std::allocator<char>_> *)&local_88,
                     (long)local_a0.
                           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           .
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_a0.
                           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           .
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
          pdVar1 = local_a0.
                   super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   .
                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          this_00 = local_a0.
                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          while (this_00 != pdVar1) {
            bVar2 = digest32<256L>::is_all_zeros(this_00);
            if (bVar2) {
              (this->super_request_callback)._vptr_request_callback = (_func_int **)0x0;
              (this->super_torrent_hot_members).m_picker._M_t.
              super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
              .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
                   (piece_picker *)0x0;
              if (local_88 != (void *)0x0) {
                operator_delete(local_88,local_78 - (long)local_88);
              }
              if (local_a0.
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  .
                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (digest32<256L> *)0x0) {
                operator_delete(local_a0.
                                super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                .
                                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_a0.
                                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                      .
                                      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_a0.
                                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                      .
                                      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              ::std::
              vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
              ::~vector(&local_b8);
              in_RDX._M_pi = extraout_RDX_00;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(a_Stack_60[0]._M_pi._4_4_,a_Stack_60[0]._M_pi._0_4_) !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(a_Stack_60[0]._M_pi._4_4_,a_Stack_60[0]._M_pi._0_4_));
                in_RDX._M_pi = extraout_RDX_01;
              }
              goto LAB_00322ba8;
            }
            ::std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                      ((vector<char,std::allocator<char>> *)&local_88,uStack_80,this_00,this_00 + 1)
            ;
            this_00 = this_00 + 1;
          }
          ::std::
          vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>
          ::emplace_back<std::vector<char,std::allocator<char>>>
                    ((vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>
                      *)&local_b8,(vector<char,_std::allocator<char>_> *)&local_88);
          if (local_88 != (void *)0x0) {
            operator_delete(local_88,local_78 - (long)local_88);
          }
          if (local_a0.
              super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
              .
              super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (digest32<256L> *)0x0) {
            operator_delete(local_a0.
                            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                            .
                            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_a0.
                                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                  .
                                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a0.
                                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                  .
                                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          this_01 = this_01 + 1;
        } while (this_01 != local_50);
        local_48.
        super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_b8.
             super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_48.
        super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ =
             local_b8.
             super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_4_;
        local_48.
        super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ =
             local_b8.
             super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._4_4_;
        local_48.
        super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
             local_b8.
             super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish._0_4_;
        local_48.
        super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
             local_b8.
             super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish._4_4_;
      }
      local_b8.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      torrent_info::set_piece_layers(local_68,(vector<aux::vector<char>,_file_index_t> *)&local_48);
      ::std::
      vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::~vector(&local_48);
      ::std::
      vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::~vector(&local_b8);
      in_RDX._M_pi = extraout_RDX_02;
    }
  }
  *(undefined4 *)&(this->super_request_callback)._vptr_request_callback = (undefined4)local_68;
  *(undefined4 *)((long)&(this->super_request_callback)._vptr_request_callback + 4) = local_68._4_4_
  ;
  *(undefined4 *)
   &(this->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
       a_Stack_60[0]._M_pi._0_4_;
  *(undefined4 *)
   ((long)&(this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> + 4) =
       a_Stack_60[0]._M_pi._4_4_;
LAB_00322ba8:
  sVar3.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar3.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::torrent_info>)
         sVar3.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_info> torrent::get_torrent_copy_with_hashes() const
	{
		if (!m_torrent_file->is_valid()) return {};
		auto ret = std::make_shared<torrent_info>(*m_torrent_file);

		if (ret->v2())
		{
			aux::vector<aux::vector<char>, file_index_t> v2_hashes;
			for (auto const& tree : m_merkle_trees)
			{
				auto const& layer = tree.get_piece_layer();
				std::vector<char> out_layer;
				out_layer.reserve(layer.size() * sha256_hash::size());
				for (auto const& h : layer)
				{
					// we're missing a piece layer. We can't return a valid
					// torrent
					if (h.is_all_zeros()) return {};
					out_layer.insert(out_layer.end(), h.data(), h.data() + sha256_hash::size());
				}
				v2_hashes.emplace_back(std::move(out_layer));
			}
			ret->set_piece_layers(std::move(v2_hashes));
		}

		return ret;
	}